

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_encoder.c
# Opt level: O2

lzma_ret lzma_delta_props_encode(void *options,uint8_t *out)

{
  lzma_ret lVar1;
  uint64_t uVar2;
  
  uVar2 = lzma_delta_coder_memusage(options);
  if (uVar2 == 0xffffffffffffffff) {
    lVar1 = LZMA_PROG_ERROR;
  }
  else {
    *out = *(char *)((long)options + 4) + 0xff;
    lVar1 = LZMA_OK;
  }
  return lVar1;
}

Assistant:

extern lzma_ret
lzma_delta_props_encode(const void *options, uint8_t *out)
{
	// The caller must have already validated the options, so it's
	// LZMA_PROG_ERROR if they are invalid.
	if (lzma_delta_coder_memusage(options) == UINT64_MAX)
		return LZMA_PROG_ERROR;

	const lzma_options_delta *opt = options;
	out[0] = opt->dist - LZMA_DELTA_DIST_MIN;

	return LZMA_OK;
}